

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

lhcell * lhNewCell(lhash_kv_engine *pEngine,lhpage *pPage)

{
  lhcell *pSrc;
  
  pSrc = (lhcell *)SyMemBackendPoolAlloc(&pEngine->sAllocator,0x80);
  if (pSrc != (lhcell *)0x0) {
    SyZero(pSrc,0x80);
    (pSrc->sKey).pBlob = (void *)0x0;
    (pSrc->sKey).nByte = 0;
    (pSrc->sKey).mByte = 0;
    (pSrc->sKey).pAllocator = &pEngine->sAllocator;
    (pSrc->sKey).nFlags = 0;
    pSrc->pPage = pPage;
  }
  return pSrc;
}

Assistant:

static lhcell * lhNewCell(lhash_kv_engine *pEngine,lhpage *pPage)
{
	lhcell *pCell;
	pCell = (lhcell *)SyMemBackendPoolAlloc(&pEngine->sAllocator,sizeof(lhcell));
	if( pCell == 0 ){
		return 0;
	}
	/* Zero the structure */
	SyZero(pCell,sizeof(lhcell));
	/* Fill in the structure */
	SyBlobInit(&pCell->sKey,&pEngine->sAllocator);
	pCell->pPage = pPage;
	return pCell;
}